

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

int lys_node_addchild(lys_node *parent,lys_module *module,lys_node *child)

{
  lys_module *plVar1;
  LYS_NODE LVar2;
  LY_STMT stmt;
  int iVar3;
  void *pvVar4;
  char *pcVar5;
  lys_node **pplVar6;
  lys_node *plVar7;
  char *pcVar8;
  lys_node *plVar9;
  lys_node *plVar10;
  LY_VLOG_ELEM elem_type;
  LYS_NODE LVar11;
  LYS_NODE LVar12;
  LY_ECODE code;
  bool bVar13;
  lyext_substmt *local_38;
  lyext_substmt *info;
  
  local_38 = (lyext_substmt *)0x0;
  if (child == (lys_node *)0x0) {
    __assert_fail("child",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                  ,0x2be,
                  "int lys_node_addchild(struct lys_node *, struct lys_module *, struct lys_node *)"
                 );
  }
  if (parent == (lys_node *)0x0) {
    if (module == (lys_module *)0x0) {
      __assert_fail("module",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                    ,0x2c4,
                    "int lys_node_addchild(struct lys_node *, struct lys_module *, struct lys_node *)"
                   );
    }
    LVar11 = child->nodetype;
    if ((LVar11 & (LYS_OUTPUT|LYS_INPUT)) != LYS_UNKNOWN) {
      __assert_fail("!(child->nodetype & (LYS_INPUT | LYS_OUTPUT))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                    ,0x2c5,
                    "int lys_node_addchild(struct lys_node *, struct lys_module *, struct lys_node *)"
                   );
    }
LAB_0014eeca:
    if ((LVar11 & 0xb9bf) == LYS_UNKNOWN) {
      pcVar8 = strnodetype(LVar11);
      ly_vlog(LYE_INCHILDSTMT,LY_VLOG_LYS,parent,pcVar8,"(sub)module");
      return 1;
    }
    bVar13 = true;
    LVar11 = LYS_UNKNOWN;
  }
  else {
    LVar11 = parent->nodetype;
    module = parent->module;
    bVar13 = true;
    switch(LVar11) {
    case LYS_UNKNOWN:
      LVar11 = child->nodetype;
      goto LAB_0014eeca;
    case LYS_CONTAINER:
switchD_0014eee9_caseD_1:
      LVar12 = child->nodetype;
      LVar2 = LVar12 & 0xd8bf;
joined_r0x0014efdc:
      if (LVar2 == LYS_UNKNOWN) goto LAB_0014f054;
      break;
    case LYS_CHOICE:
      LVar11 = child->nodetype;
      if ((LVar11 & 0x807f) == LYS_UNKNOWN) {
        pcVar5 = strnodetype(LVar11);
        pcVar8 = "choice";
LAB_0014f1cf:
        code = LYE_INCHILDSTMT;
        elem_type = LY_VLOG_LYS;
        goto LAB_0014f1db;
      }
      bVar13 = LVar11 == LYS_CASE;
      LVar11 = LYS_CHOICE;
      break;
    case LYS_CHOICE|LYS_CONTAINER:
    case LYS_LEAF|LYS_CONTAINER:
    case LYS_LEAF|LYS_CHOICE:
    case LYS_LEAF|LYS_CHOICE|LYS_CONTAINER:
      break;
    case LYS_LEAF:
    case LYS_LEAFLIST:
switchD_0014eee9_caseD_4:
      pcVar8 = strnodetype(child->nodetype);
      pcVar5 = strnodetype(parent->nodetype);
      ly_vlog(LYE_INCHILDSTMT,LY_VLOG_LYS,parent,pcVar8,pcVar5);
      pcVar8 = strnodetype(parent->nodetype);
      pcVar5 = "The \"%s\" statement cannot have any data substatement.";
      code = LYE_SPEC;
      elem_type = LY_VLOG_PREV;
      parent = (lys_node *)0x0;
      goto LAB_0014f1db;
    default:
      if (LVar11 == LYS_LIST) goto switchD_0014eee9_caseD_1;
      if (LVar11 == LYS_ANYXML) goto switchD_0014eee9_caseD_4;
      if (LVar11 == LYS_CASE) {
        if ((child->nodetype & 0x903f) == LYS_UNKNOWN) {
          pcVar5 = strnodetype(child->nodetype);
          pcVar8 = "case";
          goto LAB_0014f1cf;
        }
        LVar11 = LYS_CASE;
        break;
      }
      if (LVar11 != LYS_NOTIF) {
        if (LVar11 == LYS_RPC) {
LAB_0014ef77:
          if ((child->nodetype & (LYS_GROUPING|LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN) {
            pcVar5 = strnodetype(child->nodetype);
            pcVar8 = "rpc";
            goto LAB_0014f1cf;
          }
          break;
        }
        if ((LVar11 == LYS_INPUT) || (LVar11 == LYS_OUTPUT)) goto LAB_0014ef67;
        if ((LVar11 == LYS_GROUPING) || (LVar11 == LYS_USES)) goto switchD_0014eee9_caseD_1;
        if (LVar11 != LYS_AUGMENT) {
          if (LVar11 != LYS_ACTION) {
            if (LVar11 == LYS_ANYDATA) goto switchD_0014eee9_caseD_4;
            if (LVar11 == LYS_EXT) {
              stmt = lys_snode2stmt(child->nodetype);
              pvVar4 = lys_ext_complex_get_substmt
                                 (stmt,(lys_ext_instance_complex *)parent,&local_38);
              LVar11 = LYS_EXT;
              if (pvVar4 == (void *)0x0) {
                pcVar5 = strnodetype(child->nodetype);
                pcVar8 = *(char **)parent->name;
                goto LAB_0014f1cf;
              }
            }
            break;
          }
          goto LAB_0014ef77;
        }
        LVar12 = child->nodetype;
        LVar11 = LYS_AUGMENT;
        LVar2 = LVar12 & 0xd0ff;
        goto joined_r0x0014efdc;
      }
LAB_0014ef67:
      LVar12 = child->nodetype;
      if ((LVar12 & 0x983f) != LYS_UNKNOWN) break;
LAB_0014f054:
      pcVar5 = strnodetype(LVar12);
      pcVar8 = strnodetype(parent->nodetype);
      code = LYE_INCHILDSTMT;
      elem_type = LY_VLOG_LYS;
LAB_0014f1db:
      ly_vlog(code,elem_type,parent,pcVar5,pcVar8);
      return 1;
    }
  }
  iVar3 = lys_check_id(child,parent,module);
  if (iVar3 != 0) {
    return 1;
  }
  if (child->parent != (lys_node *)0x0) {
    lys_node_unlink(child);
  }
  LVar12 = child->nodetype;
  if (((LVar12 & (LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN) || (parent->nodetype == LYS_EXT)) {
    if (bVar13) {
      if (parent == (lys_node *)0x0) {
        plVar7 = module->data;
        if (plVar7 == (lys_node *)0x0) {
          module->data = child;
        }
        else {
          plVar9 = plVar7->prev;
          plVar9->next = child;
          child->prev = plVar9;
          plVar7->prev = child;
        }
        parent = (lys_node *)0x0;
        plVar7 = parent;
        goto LAB_0014f206;
      }
    }
    else {
      plVar7 = (lys_node *)calloc(1,0x70);
      pcVar8 = lydict_insert(module->ctx,child->name,0);
      plVar7->name = pcVar8;
      plVar7->flags = 0x40;
      plVar7->module = module;
      plVar7->nodetype = LYS_CASE;
      plVar7->prev = plVar7;
      lys_node_addchild(parent,module,plVar7);
      LVar12 = child->nodetype;
      parent = plVar7;
    }
    pplVar6 = lys_child(parent,LVar12);
    if (pplVar6 == (lys_node **)0x0) {
      __assert_fail("pchild",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                    ,0x356,
                    "int lys_node_addchild(struct lys_node *, struct lys_module *, struct lys_node *)"
                   );
    }
    plVar9 = *pplVar6;
    if (plVar9 == (lys_node *)0x0) {
      *pplVar6 = child;
      child->parent = parent;
      plVar10 = (lys_node *)0x0;
      plVar9 = child;
    }
    else if (LVar11 == LYS_AUGMENT) {
      do {
        plVar9 = plVar9->prev;
      } while (plVar9->parent != parent);
      plVar10 = plVar9->next;
      plVar9->next = child;
      child->prev = plVar9;
    }
    else {
      plVar9 = plVar9->prev;
      plVar9->next = child;
      child->prev = plVar9;
      plVar10 = (lys_node *)0x0;
    }
    while (plVar7 = plVar9->next, plVar7 != (lys_node *)0x0) {
      plVar7->parent = parent;
      plVar9 = plVar7;
    }
    plVar7 = parent;
    if (plVar10 == (lys_node *)0x0) {
      (*pplVar6)->prev = plVar9;
    }
    else {
      plVar9->next = plVar10;
      plVar10->prev = plVar9;
    }
  }
  else {
    plVar7 = parent->child;
    if (LVar12 == LYS_OUTPUT) {
      plVar9 = plVar7;
      plVar7 = plVar7->next;
    }
    else {
      parent->child = child;
      plVar9 = child;
    }
    plVar10 = plVar7->next;
    if (plVar10 == (lys_node *)0x0) {
      plVar9->prev = child;
    }
    else {
      child->next = plVar10;
      plVar10->prev = child;
      plVar7->next = (lys_node *)0x0;
    }
    plVar9 = plVar7->prev;
    child->prev = plVar9;
    if (plVar9->next != (lys_node *)0x0) {
      plVar9->next = child;
    }
    plVar7->prev = plVar7;
    child->parent = parent;
    plVar7->parent = (lys_node *)0x0;
    lys_node_free(plVar7,(_func_void_lys_node_ptr_void_ptr *)0x0,0);
    plVar7 = parent;
  }
LAB_0014f206:
  for (; parent != (lys_node *)0x0; parent = parent->parent) {
    if ((parent->nodetype & (LYS_EXT|LYS_AUGMENT|LYS_GROUPING)) != LYS_UNKNOWN) goto LAB_0014f24c;
  }
  plVar9 = child;
  if (plVar7 != (lys_node *)0x0) {
    for (; plVar9 != (lys_node *)0x0; plVar9 = plVar9->parent) {
      if ((plVar9->nodetype & (LYS_OUTPUT|LYS_INPUT|LYS_RPC|LYS_NOTIF)) != LYS_UNKNOWN)
      goto LAB_0014f24c;
    }
    if (((plVar7->flags & 2) != 0) && ((child->flags & 1) != 0)) {
      ly_vlog(LYE_INARG,LY_VLOG_LYS,child,"true","config");
      ly_vlog(LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
              "State nodes cannot have configuration nodes as children.");
      return 1;
    }
  }
LAB_0014f24c:
  LVar11 = child->nodetype;
  if (((LVar11 & (LYS_ANYDATA|LYS_LIST|LYS_LEAFLIST|LYS_LEAF|LYS_CHOICE|LYS_CONTAINER)) !=
       LYS_UNKNOWN) && ((child->flags & 0x80) != 0)) {
    for (; plVar7 != (lys_node *)0x0; plVar7 = lys_parent(plVar7)) {
      if ((plVar7->nodetype & (LYS_LIST|LYS_CONTAINER)) != LYS_UNKNOWN) {
        if ((char)plVar7->flags < '\0') break;
        plVar7->flags = plVar7->flags | 0x80;
      }
    }
  }
  if ((LVar11 & (LYS_ACTION|LYS_RPC)) != LYS_UNKNOWN) {
    plVar7 = (lys_node *)calloc(1,0x78);
    plVar7->nodetype = LYS_INPUT;
    pcVar8 = lydict_insert(child->module->ctx,"input",5);
    plVar7->name = pcVar8;
    plVar9 = (lys_node *)calloc(1,0x78);
    pcVar8 = lydict_insert(child->module->ctx,"output",6);
    plVar9->name = pcVar8;
    plVar9->nodetype = LYS_OUTPUT;
    plVar1 = child->module;
    plVar9->module = plVar1;
    plVar7->module = plVar1;
    plVar9->parent = child;
    plVar7->parent = child;
    plVar9->flags = 0x40;
    plVar7->flags = 0x40;
    plVar7->next = plVar9;
    plVar7->prev = plVar9;
    plVar9->prev = plVar7;
    child->child = plVar7;
  }
  return 0;
}

Assistant:

int
lys_node_addchild(struct lys_node *parent, struct lys_module *module, struct lys_node *child)
{
    struct lys_node *iter, *next, **pchild;
    struct lys_node_inout *in, *out, *inout;
    struct lys_node_case *c;
    int type, shortcase = 0;
    void *p;
    struct lyext_substmt *info = NULL;

    assert(child);

    if (parent) {
        type = parent->nodetype;
        module = parent->module;
    } else {
        assert(module);
        assert(!(child->nodetype & (LYS_INPUT | LYS_OUTPUT)));
        type = 0;
    }

    /* checks */
    switch (type) {
    case LYS_CONTAINER:
    case LYS_LIST:
    case LYS_GROUPING:
    case LYS_USES:
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CHOICE | LYS_CONTAINER | LYS_GROUPING | LYS_LEAF |
                 LYS_LEAFLIST | LYS_LIST | LYS_USES | LYS_ACTION | LYS_NOTIF))) {
            LOGVAL(LYE_INCHILDSTMT, LY_VLOG_LYS, parent, strnodetype(child->nodetype), strnodetype(parent->nodetype));
            return EXIT_FAILURE;
        }
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
    case LYS_NOTIF:
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CHOICE | LYS_CONTAINER | LYS_GROUPING | LYS_LEAF |
                 LYS_LEAFLIST | LYS_LIST | LYS_USES))) {
            LOGVAL(LYE_INCHILDSTMT, LY_VLOG_LYS, parent, strnodetype(child->nodetype), strnodetype(parent->nodetype));
            return EXIT_FAILURE;
        }
        break;
    case LYS_CHOICE:
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CASE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_CHOICE))) {
            LOGVAL(LYE_INCHILDSTMT, LY_VLOG_LYS, parent, strnodetype(child->nodetype), "choice");
            return EXIT_FAILURE;
        }
        if (child->nodetype != LYS_CASE) {
            shortcase = 1;
        }
        break;
    case LYS_CASE:
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_USES))) {
            LOGVAL(LYE_INCHILDSTMT, LY_VLOG_LYS, parent, strnodetype(child->nodetype), "case");
            return EXIT_FAILURE;
        }
        break;
    case LYS_RPC:
    case LYS_ACTION:
        if (!(child->nodetype & (LYS_INPUT | LYS_OUTPUT | LYS_GROUPING))) {
            LOGVAL(LYE_INCHILDSTMT, LY_VLOG_LYS, parent, strnodetype(child->nodetype), "rpc");
            return EXIT_FAILURE;
        }
        break;
    case LYS_LEAF:
    case LYS_LEAFLIST:
    case LYS_ANYXML:
    case LYS_ANYDATA:
        LOGVAL(LYE_INCHILDSTMT, LY_VLOG_LYS, parent, strnodetype(child->nodetype), strnodetype(parent->nodetype));
        LOGVAL(LYE_SPEC, LY_VLOG_PREV, NULL, "The \"%s\" statement cannot have any data substatement.",
               strnodetype(parent->nodetype));
        return EXIT_FAILURE;
    case LYS_AUGMENT:
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CASE | LYS_CHOICE | LYS_CONTAINER | LYS_LEAF
                | LYS_LEAFLIST | LYS_LIST | LYS_USES | LYS_ACTION | LYS_NOTIF))) {
            LOGVAL(LYE_INCHILDSTMT, LY_VLOG_LYS, parent, strnodetype(child->nodetype), strnodetype(parent->nodetype));
            return EXIT_FAILURE;
        }
        break;
    case LYS_UNKNOWN:
        /* top level */
        if (!(child->nodetype &
                (LYS_ANYDATA | LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_GROUPING
                | LYS_LEAFLIST | LYS_LIST | LYS_USES | LYS_RPC | LYS_NOTIF | LYS_AUGMENT))) {
            LOGVAL(LYE_INCHILDSTMT, LY_VLOG_LYS, parent, strnodetype(child->nodetype), "(sub)module");
            return EXIT_FAILURE;
        }
        break;
    case LYS_EXT:
        /* plugin-defined */
        p = lys_ext_complex_get_substmt(lys_snode2stmt(child->nodetype), (struct lys_ext_instance_complex*)parent, &info);
        if (!p) {
            LOGVAL(LYE_INCHILDSTMT, LY_VLOG_LYS, parent, strnodetype(child->nodetype),
                   ((struct lys_ext_instance_complex*)parent)->def->name);
            return EXIT_FAILURE;
        }
        /* TODO check cardinality */
        break;
    }

    /* check identifier uniqueness */
    if (lys_check_id(child, parent, module)) {
        return EXIT_FAILURE;
    }

    if (child->parent) {
        lys_node_unlink(child);
    }

    if ((child->nodetype & (LYS_INPUT | LYS_OUTPUT)) && parent->nodetype != LYS_EXT) {
        /* replace the implicit input/output node */
        if (child->nodetype == LYS_OUTPUT) {
            inout = (struct lys_node_inout *)parent->child->next;
        } else { /* LYS_INPUT */
            inout = (struct lys_node_inout *)parent->child;
            parent->child = child;
        }
        if (inout->next) {
            child->next = inout->next;
            inout->next->prev = child;
            inout->next = NULL;
        } else {
            parent->child->prev = child;
        }
        child->prev = inout->prev;
        if (inout->prev->next) {
            inout->prev->next = child;
        }
        inout->prev = (struct lys_node *)inout;
        child->parent = parent;
        inout->parent = NULL;
        lys_node_free((struct lys_node *)inout, NULL, 0);
    } else {
        if (shortcase) {
            /* create the implicit case to allow it to serve as a target of the augments,
             * it won't be printed, but it will be present in the tree */
            c = calloc(1, sizeof *c);
            c->name = lydict_insert(module->ctx, child->name, 0);
            c->flags = LYS_IMPLICIT;
            c->module = module;
            c->nodetype = LYS_CASE;
            c->prev = (struct lys_node*)c;
            lys_node_addchild(parent, module, (struct lys_node*)c);
            parent = (struct lys_node*)c;
        }
        /* connect the child correctly */
        if (!parent) {
            if (module->data) {
                module->data->prev->next = child;
                child->prev = module->data->prev;
                module->data->prev = child;
            } else {
                module->data = child;
            }
        } else {
            next = NULL;
            pchild = lys_child(parent, child->nodetype);
            assert(pchild);

            if (!(*pchild)) {
                /* the only/first child of the parent */
                *pchild = child;
                child->parent = parent;
                iter = child;
            } else if (type == LYS_AUGMENT) {
                /* add a new child as a last child of the augment (no matter if applied or not) */
                for (iter = (*pchild)->prev; iter->parent != parent; iter = iter->prev);
                next = iter->next;
                iter->next = child;
                child->prev = iter;
            } else {
                /* add a new child at the end of parent's child list */
                iter = (*pchild)->prev;
                iter->next = child;
                child->prev = iter;
            }
            while (iter->next) {
                iter = iter->next;
                iter->parent = parent;
            }
            if (next) {
                /* we are in applied augment, its target has some additional nodes after the nodes from this augment */
                iter->next = next;
                next->prev = iter;
            } else {
                (*pchild)->prev = iter;
            }
        }
    }

    /* check config value (but ignore them in groupings and augments) */
    for (iter = parent; iter && !(iter->nodetype & (LYS_GROUPING | LYS_AUGMENT | LYS_EXT)); iter = iter->parent);
    if (parent && !iter) {
        for (iter = child; iter && !(iter->nodetype & (LYS_NOTIF | LYS_INPUT | LYS_OUTPUT | LYS_RPC)); iter = iter->parent);
        if (!iter && (parent->flags & LYS_CONFIG_R) && (child->flags & LYS_CONFIG_W)) {
            LOGVAL(LYE_INARG, LY_VLOG_LYS, child, "true", "config");
            LOGVAL(LYE_SPEC, LY_VLOG_PREV, NULL, "State nodes cannot have configuration nodes as children.");
            return EXIT_FAILURE;
        }
    }

    /* propagate information about status data presence */
    if ((child->nodetype & (LYS_CONTAINER | LYS_CHOICE | LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_ANYDATA)) &&
            (child->flags & LYS_INCL_STATUS)) {
        for(iter = parent; iter; iter = lys_parent(iter)) {
            /* store it only into container or list - the only data inner nodes */
            if (iter->nodetype & (LYS_CONTAINER | LYS_LIST)) {
                if (iter->flags & LYS_INCL_STATUS) {
                    /* done, someone else set it already from here */
                    break;
                }
                /* set flag about including status data */
                iter->flags |= LYS_INCL_STATUS;
            }
        }
    }

    /* create implicit input/output nodes to have available them as possible target for augment */
    if (child->nodetype & (LYS_RPC | LYS_ACTION)) {
        in = calloc(1, sizeof *in);
        in->nodetype = LYS_INPUT;
        in->name = lydict_insert(child->module->ctx, "input", 5);
        out = calloc(1, sizeof *out);
        out->name = lydict_insert(child->module->ctx, "output", 6);
        out->nodetype = LYS_OUTPUT;
        in->module = out->module = child->module;
        in->parent = out->parent = child;
        in->flags = out->flags = LYS_IMPLICIT;
        in->next = (struct lys_node *)out;
        in->prev = (struct lys_node *)out;
        out->prev = (struct lys_node *)in;
        child->child = (struct lys_node *)in;
    }
    return EXIT_SUCCESS;
}